

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

void If_ManStop(If_Man_t *p)

{
  uint uVar1;
  If_Par_t *pIVar2;
  Vec_Mem_t *pVVar3;
  long lVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  word *pwVar7;
  void **ppvVar8;
  void *pvVar9;
  Hash_IntMan_t *__ptr;
  Vec_Int_t *pVVar10;
  Vec_Wec_t *__ptr_00;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  
  pcVar15 = (char *)p;
  if ((p->pPars->fVerbose != 0) && (p->vCutData != (Vec_Int_t *)0x0)) {
    If_ManCacheAnalize(p);
  }
  pIVar2 = p->pPars;
  if ((pIVar2->fVerbose != 0) && (pIVar2->fTruth != 0)) {
    uVar12 = 6;
    if (6 < pIVar2->nLutSize) {
      uVar12 = (ulong)(uint)pIVar2->nLutSize;
    }
    lVar13 = 0;
    uVar17 = 0;
    do {
      uVar17 = (ulong)(uint)((int)uVar17 + p->vTtMem[lVar13 + 6]->nEntries);
      lVar13 = lVar13 + 1;
    } while (uVar12 - 5 != lVar13);
    lVar13 = 0;
    iVar14 = 0;
    do {
      pVVar3 = p->vTtMem[lVar13 + 6];
      iVar14 = iVar14 + (int)((double)pVVar3->nPageAlloc * 8.0 +
                              (double)(pVVar3->iPage + 1) *
                              (double)(1 << ((byte)pVVar3->LogPageSze & 0x1f)) *
                              (double)pVVar3->nEntrySize * 8.0 + 48.0);
      lVar13 = lVar13 + 1;
    } while (uVar12 - 5 != lVar13);
    pcVar15 = "Unique truth tables = %d   Memory = %.2f MB   ";
    printf("Unique truth tables = %d   Memory = %.2f MB   ",(double)iVar14 * 9.5367431640625e-07,
           uVar17);
    lVar13 = p->timeCache[4];
    Abc_Print((int)pcVar15,"%s =","Time");
    Abc_Print((int)pcVar15,"%9.2f sec\n",(double)lVar13 / 1000000.0);
    iVar14 = p->nCacheMisses;
    if (iVar14 != 0) {
      pcVar15 = "Cache hits = %d. Cache misses = %d  (%.2f %%)\n";
      printf("Cache hits = %d. Cache misses = %d  (%.2f %%)\n",
             ((double)iVar14 * 100.0) / (double)(p->nCacheHits + iVar14));
      lVar13 = p->timeCache[0];
      Abc_Print((int)pcVar15,"%s =","Non-DSD   ");
      Abc_Print((int)pcVar15,"%9.2f sec\n",(double)lVar13 / 1000000.0);
      lVar13 = p->timeCache[1];
      Abc_Print((int)pcVar15,"%s =","DSD hits  ");
      Abc_Print((int)pcVar15,"%9.2f sec\n",(double)lVar13 / 1000000.0);
      lVar13 = p->timeCache[2];
      Abc_Print((int)pcVar15,"%s =","DSD misses");
      Abc_Print((int)pcVar15,"%9.2f sec\n",(double)lVar13 / 1000000.0);
      lVar13 = p->timeCache[1];
      lVar16 = p->timeCache[0];
      lVar4 = p->timeCache[2];
      Abc_Print((int)pcVar15,"%s =","TOTAL     ");
      Abc_Print((int)pcVar15,"%9.2f sec\n",(double)(lVar13 + lVar16 + lVar4) / 1000000.0);
      lVar13 = p->timeCache[3];
      Abc_Print((int)pcVar15,"%s =","Canon     ");
      Abc_Print((int)pcVar15,"%9.2f sec\n",(double)lVar13 / 1000000.0);
    }
  }
  if ((p->pPars->fVerbose != 0) && (p->nCutsUselessAll != 0)) {
    uVar12 = 0;
    do {
      if (p->nCutsUseless[uVar12] != 0) {
        iVar14 = 1;
        if (1 < p->nCutsCount[uVar12]) {
          iVar14 = p->nCutsCount[uVar12];
        }
        Abc_Print((int)pcVar15,"Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n",
                  ((double)p->nCutsUseless[uVar12] * 100.0) / (double)iVar14,uVar12 & 0xffffffff);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x11);
    iVar14 = 1;
    if (1 < p->nCutsCountAll) {
      iVar14 = p->nCutsCountAll;
    }
    Abc_Print((int)pcVar15,"Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n",
              ((double)p->nCutsUselessAll * 100.0) / (double)iVar14);
  }
  if (p->pIfDsdMan != (If_DsdMan_t *)0x0) {
    p->pIfDsdMan = (If_DsdMan_t *)0x0;
  }
  if ((p->pPars->fUseDsd != 0) && ((p->nCountNonDec[0] != 0 || (p->nCountNonDec[1] != 0)))) {
    printf("NonDec0 = %d.  NonDec1 = %d.\n",(ulong)(uint)p->nCountNonDec[0],
           (ulong)(uint)p->nCountNonDec[1]);
  }
  if (p->vCoAttrs != (Vec_Int_t *)0x0) {
    piVar5 = p->vCoAttrs->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vCoAttrs->pArray = (int *)0x0;
    }
    if (p->vCoAttrs != (Vec_Int_t *)0x0) {
      free(p->vCoAttrs);
      p->vCoAttrs = (Vec_Int_t *)0x0;
    }
  }
  pVVar6 = p->vCis;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = p->vCos;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = p->vObjs;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = p->vTemp;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  if (p->vCover != (Vec_Int_t *)0x0) {
    piVar5 = p->vCover->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vCover->pArray = (int *)0x0;
    }
    if (p->vCover != (Vec_Int_t *)0x0) {
      free(p->vCover);
      p->vCover = (Vec_Int_t *)0x0;
    }
  }
  if (p->vArray != (Vec_Int_t *)0x0) {
    piVar5 = p->vArray->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vArray->pArray = (int *)0x0;
    }
    if (p->vArray != (Vec_Int_t *)0x0) {
      free(p->vArray);
      p->vArray = (Vec_Int_t *)0x0;
    }
  }
  if (p->vAnds != (Vec_Wrd_t *)0x0) {
    pwVar7 = p->vAnds->pArray;
    if (pwVar7 != (word *)0x0) {
      free(pwVar7);
      p->vAnds->pArray = (word *)0x0;
    }
    if (p->vAnds != (Vec_Wrd_t *)0x0) {
      free(p->vAnds);
      p->vAnds = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vAndGate != (Vec_Wrd_t *)0x0) {
    pwVar7 = p->vAndGate->pArray;
    if (pwVar7 != (word *)0x0) {
      free(pwVar7);
      p->vAndGate->pArray = (word *)0x0;
    }
    if (p->vAndGate != (Vec_Wrd_t *)0x0) {
      free(p->vAndGate);
      p->vAndGate = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vOrGate != (Vec_Wrd_t *)0x0) {
    pwVar7 = p->vOrGate->pArray;
    if (pwVar7 != (word *)0x0) {
      free(pwVar7);
      p->vOrGate->pArray = (word *)0x0;
    }
    if (p->vOrGate != (Vec_Wrd_t *)0x0) {
      free(p->vOrGate);
      p->vOrGate = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vObjsRev != (Vec_Ptr_t *)0x0) {
    ppvVar8 = p->vObjsRev->pArray;
    if (ppvVar8 != (void **)0x0) {
      free(ppvVar8);
      p->vObjsRev->pArray = (void **)0x0;
    }
    if (p->vObjsRev != (Vec_Ptr_t *)0x0) {
      free(p->vObjsRev);
      p->vObjsRev = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vLatchOrder != (Vec_Ptr_t *)0x0) {
    ppvVar8 = p->vLatchOrder->pArray;
    if (ppvVar8 != (void **)0x0) {
      free(ppvVar8);
      p->vLatchOrder->pArray = (void **)0x0;
    }
    if (p->vLatchOrder != (Vec_Ptr_t *)0x0) {
      free(p->vLatchOrder);
      p->vLatchOrder = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vLags != (Vec_Int_t *)0x0) {
    piVar5 = p->vLags->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vLags->pArray = (int *)0x0;
    }
    if (p->vLags != (Vec_Int_t *)0x0) {
      free(p->vLags);
      p->vLags = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDump != (Vec_Int_t *)0x0) {
    piVar5 = p->vDump->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vDump->pArray = (int *)0x0;
    }
    if (p->vDump != (Vec_Int_t *)0x0) {
      free(p->vDump);
      p->vDump = (Vec_Int_t *)0x0;
    }
  }
  lVar13 = 0xab;
  do {
    if (*(long *)(p->nObjs + lVar13 * 2 + -0x10) != 0) {
      pvVar9 = *(void **)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8) = 0;
      }
      if (*(void **)(p->nObjs + lVar13 * 2 + -0x10) != (void *)0x0) {
        free(*(void **)(p->nObjs + lVar13 * 2 + -0x10));
        (p->nObjs + lVar13 * 2 + -0x10)[0] = 0;
        (p->nObjs + lVar13 * 2 + -0x10)[1] = 0;
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0xa5;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  lVar13 = 0xbb;
  do {
    if (*(long *)(p->nObjs + lVar13 * 2 + -0x10) != 0) {
      pvVar9 = *(void **)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8) = 0;
      }
      if (*(void **)(p->nObjs + lVar13 * 2 + -0x10) != (void *)0x0) {
        free(*(void **)(p->nObjs + lVar13 * 2 + -0x10));
        (p->nObjs + lVar13 * 2 + -0x10)[0] = 0;
        (p->nObjs + lVar13 * 2 + -0x10)[1] = 0;
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0xb5;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  lVar13 = 0xcb;
  do {
    if (*(long *)(p->nObjs + lVar13 * 2 + -0x10) != 0) {
      pvVar9 = *(void **)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8) = 0;
      }
      if (*(void **)(p->nObjs + lVar13 * 2 + -0x10) != (void *)0x0) {
        free(*(void **)(p->nObjs + lVar13 * 2 + -0x10));
        (p->nObjs + lVar13 * 2 + -0x10)[0] = 0;
        (p->nObjs + lVar13 * 2 + -0x10)[1] = 0;
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0xc5;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  lVar13 = 0xdb;
  do {
    if (*(long *)(p->nObjs + lVar13 * 2 + -0x10) != 0) {
      pvVar9 = *(void **)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8) = 0;
      }
      if (*(void **)(p->nObjs + lVar13 * 2 + -0x10) != (void *)0x0) {
        free(*(void **)(p->nObjs + lVar13 * 2 + -0x10));
        (p->nObjs + lVar13 * 2 + -0x10)[0] = 0;
        (p->nObjs + lVar13 * 2 + -0x10)[1] = 0;
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0xd5;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  if (p->vCutData != (Vec_Int_t *)0x0) {
    piVar5 = p->vCutData->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vCutData->pArray = (int *)0x0;
    }
    if (p->vCutData != (Vec_Int_t *)0x0) {
      free(p->vCutData);
      p->vCutData = (Vec_Int_t *)0x0;
    }
  }
  if (p->vPairRes != (Vec_Int_t *)0x0) {
    piVar5 = p->vPairRes->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vPairRes->pArray = (int *)0x0;
    }
    if (p->vPairRes != (Vec_Int_t *)0x0) {
      free(p->vPairRes);
      p->vPairRes = (Vec_Int_t *)0x0;
    }
  }
  if (p->vPairPerms != (Vec_Str_t *)0x0) {
    pcVar15 = p->vPairPerms->pArray;
    if (pcVar15 != (char *)0x0) {
      free(pcVar15);
      p->vPairPerms->pArray = (char *)0x0;
    }
    if (p->vPairPerms != (Vec_Str_t *)0x0) {
      free(p->vPairPerms);
      p->vPairPerms = (Vec_Str_t *)0x0;
    }
  }
  if (p->vVisited != (Vec_Ptr_t *)0x0) {
    ppvVar8 = p->vVisited->pArray;
    if (ppvVar8 != (void **)0x0) {
      free(ppvVar8);
      p->vVisited->pArray = (void **)0x0;
    }
    if (p->vVisited != (Vec_Ptr_t *)0x0) {
      free(p->vVisited);
      p->vVisited = (Vec_Ptr_t *)0x0;
    }
  }
  __ptr = p->vPairHash;
  if (__ptr != (Hash_IntMan_t *)0x0) {
    pVVar10 = __ptr->vObjs;
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      pVVar10->pArray = (int *)0x0;
    }
    if (pVVar10 != (Vec_Int_t *)0x0) {
      free(pVVar10);
    }
    pVVar10 = __ptr->vTable;
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      pVVar10->pArray = (int *)0x0;
    }
    if (pVVar10 != (Vec_Int_t *)0x0) {
      free(pVVar10);
    }
    free(__ptr);
  }
  lVar13 = 0x8b;
  do {
    lVar16 = *(long *)(p->nObjs + lVar13 * 2 + -0x10);
    if (lVar16 != 0) {
      if (*(long *)(lVar16 + 0x20) != 0) {
        pvVar9 = *(void **)(*(long *)(lVar16 + 0x20) + 8);
        if (pvVar9 != (void *)0x0) {
          free(pvVar9);
          *(undefined8 *)(*(long *)(lVar16 + 0x20) + 8) = 0;
        }
        if (*(void **)(lVar16 + 0x20) != (void *)0x0) {
          free(*(void **)(lVar16 + 0x20));
          *(undefined8 *)(lVar16 + 0x20) = 0;
        }
      }
      if (*(long *)(lVar16 + 0x28) != 0) {
        pvVar9 = *(void **)(*(long *)(lVar16 + 0x28) + 8);
        if (pvVar9 != (void *)0x0) {
          free(pvVar9);
          *(undefined8 *)(*(long *)(lVar16 + 0x28) + 8) = 0;
        }
        if (*(void **)(lVar16 + 0x28) != (void *)0x0) {
          free(*(void **)(lVar16 + 0x28));
          *(undefined8 *)(lVar16 + 0x28) = 0;
        }
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0x85;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  uVar12 = 6;
  do {
    pVVar3 = p->vTtMem[uVar12];
    if (pVVar3 != (Vec_Mem_t *)0x0) {
      if (-1 < pVVar3->iPage) {
        lVar13 = -1;
        do {
          if (pVVar3->ppPages[lVar13 + 1] != (word *)0x0) {
            free(pVVar3->ppPages[lVar13 + 1]);
            pVVar3->ppPages[lVar13 + 1] = (word *)0x0;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar3->iPage);
      }
      if (pVVar3->ppPages != (word **)0x0) {
        free(pVVar3->ppPages);
        pVVar3->ppPages = (word **)0x0;
      }
      free(pVVar3);
      p->vTtMem[uVar12] = (Vec_Mem_t *)0x0;
    }
    uVar1 = p->pPars->nLutSize;
    uVar17 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar17 = 6;
    }
    bVar18 = uVar12 < uVar17;
    uVar12 = uVar12 + 1;
  } while (bVar18);
  uVar12 = 6;
  do {
    __ptr_00 = p->vTtIsops[uVar12];
    if (__ptr_00 != (Vec_Wec_t *)0x0) {
      if (0 < __ptr_00->nCap) {
        lVar16 = 8;
        lVar13 = 0;
        do {
          pvVar9 = *(void **)((long)&__ptr_00->pArray->nCap + lVar16);
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
            *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar16) = 0;
          }
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 0x10;
        } while (lVar13 < __ptr_00->nCap);
      }
      if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
        free(__ptr_00->pArray);
        __ptr_00->pArray = (Vec_Int_t *)0x0;
      }
      __ptr_00->nCap = 0;
      __ptr_00->nSize = 0;
      free(__ptr_00);
      p->vTtIsops[uVar12] = (Vec_Wec_t *)0x0;
    }
    uVar1 = p->pPars->nLutSize;
    uVar17 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar17 = 6;
    }
    bVar18 = uVar12 < uVar17;
    uVar12 = uVar12 + 1;
  } while (bVar18);
  lVar13 = 0xeb;
  do {
    if (*(long *)(p->nObjs + lVar13 * 2 + -0x10) != 0) {
      pvVar9 = *(void **)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8);
      if (pvVar9 != (void *)0x0) {
        free(pvVar9);
        *(undefined8 *)(*(long *)(p->nObjs + lVar13 * 2 + -0x10) + 8) = 0;
      }
      if (*(void **)(p->nObjs + lVar13 * 2 + -0x10) != (void *)0x0) {
        free(*(void **)(p->nObjs + lVar13 * 2 + -0x10));
        (p->nObjs + lVar13 * 2 + -0x10)[0] = 0;
        (p->nObjs + lVar13 * 2 + -0x10)[1] = 0;
      }
    }
    uVar1 = p->pPars->nLutSize;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 7) {
      uVar12 = 6;
    }
    uVar17 = lVar13 - 0xe5;
    lVar13 = lVar13 + 1;
  } while (uVar17 < uVar12);
  Mem_FixedStop(p->pMemObj,0);
  pVVar3 = p->vTtMem6;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    if (pVVar3->vTable != (Vec_Int_t *)0x0) {
      piVar5 = pVVar3->vTable->pArray;
      if (piVar5 != (int *)0x0) {
        free(piVar5);
        pVVar3->vTable->pArray = (int *)0x0;
      }
      if (pVVar3->vTable != (Vec_Int_t *)0x0) {
        free(pVVar3->vTable);
        pVVar3->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
      piVar5 = pVVar3->vNexts->pArray;
      if (piVar5 != (int *)0x0) {
        free(piVar5);
        pVVar3->vNexts->pArray = (int *)0x0;
      }
      if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar3->vNexts);
        pVVar3->vNexts = (Vec_Int_t *)0x0;
      }
    }
    pVVar3 = p->vTtMem6;
    if (pVVar3 != (Vec_Mem_t *)0x0) {
      if (-1 < pVVar3->iPage) {
        lVar13 = -1;
        do {
          if (pVVar3->ppPages[lVar13 + 1] != (word *)0x0) {
            free(pVVar3->ppPages[lVar13 + 1]);
            pVVar3->ppPages[lVar13 + 1] = (word *)0x0;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar3->iPage);
      }
      if (pVVar3->ppPages != (word **)0x0) {
        free(pVVar3->ppPages);
        pVVar3->ppPages = (word **)0x0;
      }
      free(pVVar3);
      p->vTtMem6 = (Vec_Mem_t *)0x0;
    }
  }
  if (p->pMemCi != (If_Set_t *)0x0) {
    free(p->pMemCi);
    p->pMemCi = (If_Set_t *)0x0;
  }
  if (p->pMemAnd != (If_Set_t *)0x0) {
    free(p->pMemAnd);
    p->pMemAnd = (If_Set_t *)0x0;
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  if (p->puTempW != (word *)0x0) {
    free(p->puTempW);
    p->puTempW = (word *)0x0;
  }
  pfVar11 = p->pPars->pTimesArr;
  if (pfVar11 != (float *)0x0) {
    free(pfVar11);
    p->pPars->pTimesArr = (float *)0x0;
  }
  pfVar11 = p->pPars->pTimesReq;
  if (pfVar11 != (float *)0x0) {
    free(pfVar11);
    p->pPars->pTimesReq = (float *)0x0;
  }
  if (p->pManTim != (Tim_Man_t *)0x0) {
    Tim_ManStop(p->pManTim);
  }
  pVVar10 = p->vSwitching;
  if (pVVar10 != (Vec_Int_t *)0x0) {
    if (pVVar10->pArray != (int *)0x0) {
      free(pVVar10->pArray);
      pVVar10->pArray = (int *)0x0;
    }
    free(pVVar10);
  }
  if (p->pPars->fUseBat != 0) {
    Bat_ManFuncSetdownTable();
  }
  if (p->pHashTable[0] != (void **)0x0) {
    free(p->pHashTable[0]);
    p->pHashTable[0] = (void **)0x0;
  }
  if (p->pHashTable[1] != (void **)0x0) {
    free(p->pHashTable[1]);
    p->pHashTable[1] = (void **)0x0;
  }
  if (p->pMemEntries != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(p->pMemEntries,0);
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  free(p);
  return;
}

Assistant:

void If_ManStop( If_Man_t * p )
{
    extern void If_ManCacheAnalize( If_Man_t * p );
    int i;
    if ( p->pPars->fVerbose && p->vCutData )
        If_ManCacheAnalize( p );
    if ( p->pPars->fVerbose && p->pPars->fTruth )
    {
        int nUnique = 0, nMemTotal = 0;
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nUnique += Vec_MemEntryNum(p->vTtMem[i]);
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nMemTotal += (int)Vec_MemMemory(p->vTtMem[i]);
        printf( "Unique truth tables = %d   Memory = %.2f MB   ", nUnique, 1.0 * nMemTotal / (1<<20) ); 
        Abc_PrintTime( 1, "Time", p->timeCache[4] );
        if ( p->nCacheMisses )
        {
            printf( "Cache hits = %d. Cache misses = %d  (%.2f %%)\n", p->nCacheHits, p->nCacheMisses, 100.0 * p->nCacheMisses / (p->nCacheHits + p->nCacheMisses) ); 
            Abc_PrintTime( 1, "Non-DSD   ", p->timeCache[0] );
            Abc_PrintTime( 1, "DSD hits  ", p->timeCache[1] );
            Abc_PrintTime( 1, "DSD misses", p->timeCache[2] );
            Abc_PrintTime( 1, "TOTAL     ", p->timeCache[0] + p->timeCache[1] + p->timeCache[2] );
            Abc_PrintTime( 1, "Canon     ", p->timeCache[3] );
        }
    }
    if ( p->pPars->fVerbose && p->nCutsUselessAll )
    {
        for ( i = 0; i <= 16; i++ )
            if ( p->nCutsUseless[i] )
                Abc_Print( 1, "Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n", i, p->nCutsUseless[i], p->nCutsCount[i], 100.0*p->nCutsUseless[i]/Abc_MaxInt(p->nCutsCount[i],1) );
        Abc_Print( 1, "Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n", p->nCutsUselessAll, p->nCutsCountAll, 100.0*p->nCutsUselessAll/Abc_MaxInt(p->nCutsCountAll,1) );
    }
//    if ( p->pPars->fVerbose && p->nCuts5 )
//        Abc_Print( 1, "Statistics about 5-cuts: Total = %d  Non-decomposable = %d (%.2f %%)\n", p->nCuts5, p->nCuts5-p->nCuts5a, 100.0*(p->nCuts5-p->nCuts5a)/p->nCuts5 );
    if ( p->pIfDsdMan )
        p->pIfDsdMan = NULL;
    if ( p->pPars->fUseDsd && (p->nCountNonDec[0] || p->nCountNonDec[1]) )
        printf( "NonDec0 = %d.  NonDec1 = %d.\n", p->nCountNonDec[0], p->nCountNonDec[1] );
    Vec_IntFreeP( &p->vCoAttrs );
    Vec_PtrFree( p->vCis );
    Vec_PtrFree( p->vCos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vTemp );
    Vec_IntFreeP( &p->vCover );
    Vec_IntFreeP( &p->vArray );
    Vec_WrdFreeP( &p->vAnds );
    Vec_WrdFreeP( &p->vAndGate );
    Vec_WrdFreeP( &p->vOrGate );
    Vec_PtrFreeP( &p->vObjsRev );
    Vec_PtrFreeP( &p->vLatchOrder );
    Vec_IntFreeP( &p->vLags );
    Vec_IntFreeP( &p->vDump );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDsds[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtPerms[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtVars[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDecs[i] );
    Vec_IntFreeP( &p->vCutData );
    Vec_IntFreeP( &p->vPairRes );
    Vec_StrFreeP( &p->vPairPerms );
    Vec_PtrFreeP( &p->vVisited );
    if ( p->vPairHash )
        Hash_IntManStop( p->vPairHash );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemHashFree( p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemFreeP( &p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_WecFreeP( &p->vTtIsops[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtOccurs[i] );
    Mem_FixedStop( p->pMemObj, 0 );
    if ( p->vTtMem6 )
    {
        Vec_MemHashFree( p->vTtMem6 );
        Vec_MemFreeP( &p->vTtMem6 );
    }
    ABC_FREE( p->pMemCi );
    ABC_FREE( p->pMemAnd );
    ABC_FREE( p->puTemp[0] );
    ABC_FREE( p->puTempW );
    // free pars memory
    ABC_FREE( p->pPars->pTimesArr );
    ABC_FREE( p->pPars->pTimesReq );
    if ( p->pManTim )
        Tim_ManStop( p->pManTim );
    if ( p->vSwitching )
        Vec_IntFree( p->vSwitching );
    if ( p->pPars->fUseBat )
    {
        extern void Bat_ManFuncSetdownTable();
        Bat_ManFuncSetdownTable();
    }
    // hash table
//    if ( p->pPars->fVerbose && p->nTableEntries[0] )
//        printf( "Hash table 2:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[0], p->nTableSize[0] );
//    if ( p->pPars->fVerbose && p->nTableEntries[1] )
//        printf( "Hash table 3:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[1], p->nTableSize[1] );
    ABC_FREE( p->pHashTable[0] );
    ABC_FREE( p->pHashTable[1] );
    if ( p->pMemEntries )
        Mem_FixedStop( p->pMemEntries, 0 );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}